

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

uint32 __thiscall
Clasp::UncoreMinimize::allocCore
          (UncoreMinimize *this,WeightConstraint *con,weight_t bound,weight_t weight,bool open)

{
  reference pCVar1;
  weight_t in_ECX;
  weight_t in_EDX;
  WeightConstraint *in_RSI;
  long in_RDI;
  byte in_R8B;
  uint32 fp;
  WeightConstraint *in_stack_ffffffffffffffa8;
  pod_vector<Clasp::UncoreMinimize::Core,_std::allocator<Clasp::UncoreMinimize::Core>_>
  *in_stack_ffffffffffffffb0;
  Core local_48;
  size_type local_34;
  byte local_21;
  weight_t local_20;
  weight_t local_1c;
  WeightConstraint *local_18;
  size_type local_4;
  
  local_21 = in_R8B & 1;
  if (local_21 == 0) {
    bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::push_back
              ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
               in_stack_ffffffffffffffb0,(Constraint **)in_stack_ffffffffffffffa8);
    local_4 = 0;
  }
  else if (*(int *)(in_RDI + 0x100) == 0) {
    Core::Core((Core *)&stack0xffffffffffffffa8,in_RSI,in_EDX,in_ECX);
    bk_lib::pod_vector<Clasp::UncoreMinimize::Core,_std::allocator<Clasp::UncoreMinimize::Core>_>::
    push_back(in_stack_ffffffffffffffb0,(Core *)in_stack_ffffffffffffffa8);
    local_4 = bk_lib::
              pod_vector<Clasp::UncoreMinimize::Core,_std::allocator<Clasp::UncoreMinimize::Core>_>
              ::size((pod_vector<Clasp::UncoreMinimize::Core,_std::allocator<Clasp::UncoreMinimize::Core>_>
                      *)(in_RDI + 0x38));
  }
  else {
    local_34 = *(int *)(in_RDI + 0x100) - 1;
    local_20 = in_ECX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    pCVar1 = bk_lib::
             pod_vector<Clasp::UncoreMinimize::Core,_std::allocator<Clasp::UncoreMinimize::Core>_>::
             operator[]((pod_vector<Clasp::UncoreMinimize::Core,_std::allocator<Clasp::UncoreMinimize::Core>_>
                         *)(in_RDI + 0x38),local_34);
    *(weight_t *)(in_RDI + 0x100) = pCVar1->weight;
    Core::Core(&local_48,local_18,local_1c,local_20);
    pCVar1 = bk_lib::
             pod_vector<Clasp::UncoreMinimize::Core,_std::allocator<Clasp::UncoreMinimize::Core>_>::
             operator[]((pod_vector<Clasp::UncoreMinimize::Core,_std::allocator<Clasp::UncoreMinimize::Core>_>
                         *)(in_RDI + 0x38),local_34);
    pCVar1->con = local_48.con;
    pCVar1->bound = local_48.bound;
    pCVar1->weight = local_48.weight;
    local_4 = local_34 + 1;
  }
  return local_4;
}

Assistant:

uint32 UncoreMinimize::allocCore(WeightConstraint* con, weight_t bound, weight_t weight, bool open) {
	if (!open) {
		closed_.push_back(con);
		return 0;
	}
	if (freeOpen_) { // pop next slot from free list
		uint32 fp = freeOpen_ - 1;
		assert(open_[fp].con == 0 && open_[fp].bound == static_cast<weight_t>(0xDEADC0DE));
		freeOpen_ = static_cast<uint32>(open_[fp].weight);
		open_[fp] = Core(con, bound, weight);
		return fp + 1;
	}
	open_.push_back(Core(con, bound, weight));
	return static_cast<uint32>(open_.size());
}